

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicHeap.hpp
# Opt level: O3

void __thiscall
Lib::
DynamicHeap<unsigned_int,_DP::SimpleCongruenceClosure::ConstOrderingComparator,_Lib::ArrayMap<unsigned_int>,_unsigned_int>
::fixDecrease1(DynamicHeap<unsigned_int,_DP::SimpleCongruenceClosure::ConstOrderingComparator,_Lib::ArrayMap<unsigned_int>,_unsigned_int>
               *this,size_t idx)

{
  uint uVar1;
  uint uVar2;
  ArrayMapEntry<unsigned_int> *pAVar3;
  bool bVar4;
  Comparison CVar5;
  uint *puVar6;
  ulong uVar7;
  
  if (1 < idx) {
    puVar6 = (this->_heap)._array;
    do {
      uVar7 = idx >> 1;
      CVar5 = DP::SimpleCongruenceClosure::ConstOrderingComparator::compare
                        (&this->_cmp,puVar6[uVar7 - 1],puVar6[idx - 1]);
      if (CVar5 != GREATER) {
        return;
      }
      puVar6 = (this->_heap)._array;
      uVar1 = puVar6[idx - 1];
      puVar6[idx - 1] = puVar6[uVar7 - 1];
      puVar6[uVar7 - 1] = uVar1;
      uVar1 = puVar6[idx - 1];
      pAVar3 = (this->_elMap).super_DArray<Lib::ArrayMapEntry<unsigned_int>_>._array;
      pAVar3[uVar1]._obj = (uint)idx;
      uVar2 = (this->_elMap)._timestamp;
      pAVar3[uVar1]._timestamp = uVar2;
      uVar1 = puVar6[uVar7 - 1];
      pAVar3[uVar1]._obj = (uint)uVar7;
      pAVar3[uVar1]._timestamp = uVar2;
      bVar4 = 3 < idx;
      idx = uVar7;
    } while (bVar4);
  }
  return;
}

Assistant:

void fixDecrease1(size_t idx)
  {
    ASS_G(idx, 0);
    ASS_LE(idx, size());

    while(idx>1) {
      size_t parent = idx/2;
      if(!isGreater1(parent, idx)) {
	break;
      }
      swapInHeap1(idx, parent);
      idx = parent;
    }
  }